

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::MaterialNode> *mnode)

{
  map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
  *this_00;
  mapped_type_conflict1 id;
  MaterialNode *pMVar1;
  ostream *poVar2;
  iterator iVar3;
  mapped_type_conflict1 *pmVar4;
  OBJMaterial *pOVar5;
  ThinDielectricMaterial *pTVar6;
  MetalMaterial *pMVar7;
  VelvetMaterial *pVVar8;
  DielectricMaterial *pDVar9;
  MetallicPaintMaterial *pMVar10;
  MatteMaterial *pMVar11;
  MirrorMaterial *pMVar12;
  HairMaterial *pHVar13;
  runtime_error *this_01;
  Ref<embree::SceneGraph::Node> node;
  Ref<embree::HairMaterial> local_90;
  Ref<embree::MetalMaterial> local_88;
  Ref<embree::MirrorMaterial> local_80;
  Ref<embree::MatteMaterial> local_78;
  Ref<embree::MetallicPaintMaterial> local_70;
  Ref<embree::DielectricMaterial> local_68;
  Ref<embree::VelvetMaterial> local_60;
  Ref<embree::MetalMaterial> local_58;
  Ref<embree::ThinDielectricMaterial> local_50;
  Ref<embree::OBJMaterial> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->referenceMaterials == true) {
    tab(this);
    std::operator+(&local_40,"<material id=\"",&(mnode->ptr->super_Node).name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,
                   &local_40,"\"/>");
    poVar2 = std::operator<<((ostream *)&this->field_0x10,(string *)&node);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&node);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    node.ptr = &mnode->ptr->super_Node;
    if (node.ptr != (Node *)0x0) {
      (*(((Node *)&(node.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
    }
    this_00 = &this->nodeMap;
    iVar3 = std::
            _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
            ::find(&this_00->_M_t,&node);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header) {
      id = this->currentNodeID;
      this->currentNodeID = id + 1;
      pmVar4 = std::
               map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
               ::operator[](this_00,&node);
      *pmVar4 = id;
      pMVar1 = mnode->ptr;
      if (pMVar1 == (MaterialNode *)0x0) {
LAB_001876db:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"unsupported material");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pOVar5 = (OBJMaterial *)
               __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,&OBJMaterial::typeinfo,0);
      if (pOVar5 == (OBJMaterial *)0x0) {
        pTVar6 = (ThinDielectricMaterial *)
                 __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                &ThinDielectricMaterial::typeinfo,0);
        if (pTVar6 == (ThinDielectricMaterial *)0x0) {
          pMVar7 = (MetalMaterial *)
                   __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                  &MetalMaterial::typeinfo,0);
          if (pMVar7 == (MetalMaterial *)0x0) {
            pVVar8 = (VelvetMaterial *)
                     __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                    &VelvetMaterial::typeinfo,0);
            if (pVVar8 == (VelvetMaterial *)0x0) {
              pDVar9 = (DielectricMaterial *)
                       __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                      &DielectricMaterial::typeinfo,0);
              if (pDVar9 == (DielectricMaterial *)0x0) {
                pMVar10 = (MetallicPaintMaterial *)
                          __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                         &MetallicPaintMaterial::typeinfo,0);
                if (pMVar10 == (MetallicPaintMaterial *)0x0) {
                  pMVar11 = (MatteMaterial *)
                            __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                           &MatteMaterial::typeinfo,0);
                  if (pMVar11 == (MatteMaterial *)0x0) {
                    pMVar12 = (MirrorMaterial *)
                              __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                             &MirrorMaterial::typeinfo,0);
                    if (pMVar12 == (MirrorMaterial *)0x0) {
                      pMVar7 = (MetalMaterial *)
                               __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                              &MetalMaterial::typeinfo,0);
                      if (pMVar7 == (MetalMaterial *)0x0) {
                        pHVar13 = (HairMaterial *)
                                  __dynamic_cast(pMVar1,&SceneGraph::MaterialNode::typeinfo,
                                                 &HairMaterial::typeinfo,0);
                        if (pHVar13 == (HairMaterial *)0x0) goto LAB_001876db;
                        (*(pHVar13->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                                  (pHVar13);
                        local_90.ptr = pHVar13;
                        (*(pHVar13->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                                  (pHVar13);
                        store(this,&local_90,id);
                        (*(pHVar13->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                                  (pHVar13);
                        (*(pHVar13->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                                  (pHVar13);
                      }
                      else {
                        (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                                  (pMVar7);
                        local_88.ptr = pMVar7;
                        (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                                  (pMVar7);
                        store(this,&local_88,id);
                        (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                                  (pMVar7);
                        (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                                  (pMVar7);
                      }
                    }
                    else {
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                                (pMVar12);
                      local_80.ptr = pMVar12;
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                                (pMVar12);
                      store(this,&local_80,id);
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                                (pMVar12);
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                                (pMVar12);
                    }
                  }
                  else {
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                              (pMVar11);
                    local_78.ptr = pMVar11;
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                              (pMVar11);
                    store(this,&local_78,id);
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                              (pMVar11);
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                              (pMVar11);
                  }
                }
                else {
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                            (pMVar10);
                  local_70.ptr = pMVar10;
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])
                            (pMVar10);
                  store(this,&local_70,id);
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                            (pMVar10);
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])
                            (pMVar10);
                }
              }
              else {
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pDVar9);
                local_68.ptr = pDVar9;
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pDVar9);
                store(this,&local_68,id);
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pDVar9);
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pDVar9);
              }
            }
            else {
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pVVar8);
              local_60.ptr = pVVar8;
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pVVar8);
              store(this,&local_60,id);
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pVVar8);
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pVVar8);
            }
          }
          else {
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar7);
            local_58.ptr = pMVar7;
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar7);
            store(this,&local_58,id);
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pMVar7);
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pMVar7);
          }
        }
        else {
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pTVar6);
          local_50.ptr = pTVar6;
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pTVar6);
          store(this,&local_50,id);
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pTVar6);
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pTVar6);
        }
      }
      else {
        (*(pOVar5->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar5);
        local_48.ptr = pOVar5;
        (*(pOVar5->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar5);
        store(this,&local_48,id);
        (*(pOVar5->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar5);
        (*(pOVar5->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar5);
      }
    }
    else {
      tab(this);
      poVar2 = std::operator<<((ostream *)&this->field_0x10,"<material id=\"");
      std::
      map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
      ::operator[](this_00,&node);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,"\"/>");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    if (node.ptr != (Node *)0x0) {
      (*((node.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::MaterialNode> mnode)
  {
    /* let materials reference by their name, allows separate bindings of materials */
    if (referenceMaterials) {
      tab(); xml << "<material id=\""+mnode->name+"\"/>" << std::endl;
      return;
    }
    
    Ref<SceneGraph::Node> node = mnode.dynamicCast<SceneGraph::Node>();
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<material id=\"" << nodeMap[node] << "\"/>" << std::endl;
      return;
    }
    const ssize_t id = nodeMap[node] = currentNodeID++;

    if      (Ref<OBJMaterial> m = mnode.dynamicCast<OBJMaterial>()) store(m,id);
    else if (Ref<ThinDielectricMaterial> m = mnode.dynamicCast<ThinDielectricMaterial>()) store(m,id);
    else if (Ref<MetalMaterial> m = mnode.dynamicCast<MetalMaterial>()) store(m,id);
    else if (Ref<VelvetMaterial> m = mnode.dynamicCast<VelvetMaterial>()) store(m,id);
    else if (Ref<DielectricMaterial> m = mnode.dynamicCast<DielectricMaterial>()) store(m,id);
    else if (Ref<MetallicPaintMaterial> m = mnode.dynamicCast<MetallicPaintMaterial>()) store(m,id);
    else if (Ref<MatteMaterial> m = mnode.dynamicCast<MatteMaterial>()) store(m,id);
    else if (Ref<MirrorMaterial> m = mnode.dynamicCast<MirrorMaterial>()) store(m,id);
    else if (Ref<ReflectiveMetalMaterial> m = mnode.dynamicCast<ReflectiveMetalMaterial>()) store(m,id);
    else if (Ref<HairMaterial> m = mnode.dynamicCast<HairMaterial>()) store(m,id);
    else throw std::runtime_error("unsupported material");
  }